

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_approx.h
# Opt level: O0

Context __thiscall
mp::
FuncConConverter_MIP_CRTP<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>
::Convert(FuncConConverter_MIP_CRTP<mp::FuncConConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>_>
          *this,ItemType *con,int param_3)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  const_reference pvVar6;
  MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pMVar7;
  double *pdVar8;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar9;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *this_00;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  char *conName;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_01;
  double dVar10;
  NodeRange NVar11;
  NodeRange NVar12;
  NodeRange factor;
  NodeRange rmd;
  double ubx1;
  double lbx1;
  double ubx;
  double lbx;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  warn;
  double dm;
  PLApproxParams laPrm;
  int y;
  value_type x;
  undefined4 in_stack_fffffffffffff718;
  Type in_stack_fffffffffffff71c;
  NodeIndexRange in_stack_fffffffffffff720;
  ValueNode *in_stack_fffffffffffff728;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff730;
  vector<double,_std::allocator<double>_> *this_02;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff738;
  int *piVar13;
  Context in_stack_fffffffffffff744;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff750;
  AlgConRhs<0> rr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff77c;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AsinhId>
  *in_stack_fffffffffffff780;
  vector<int,_std::allocator<int>_> *v;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined1 replace;
  string *in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff798;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff7a0;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  *in_stack_fffffffffffff7a8;
  undefined8 in_stack_fffffffffffff7b0;
  Arguments args;
  double in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  undefined8 in_stack_fffffffffffff7d8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff7e0;
  undefined7 in_stack_fffffffffffff830;
  AlgConRhs<0> local_790;
  undefined1 local_785 [60];
  undefined1 local_749 [25];
  undefined1 *local_730;
  undefined8 local_728;
  CtxVal local_5ec;
  vector<int,_std::allocator<int>_> local_544 [6];
  NodeRange local_4a0;
  NodeRange local_490;
  CtxVal local_47c;
  value_type local_3d4;
  string local_330 [32];
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  string local_1e0 [32];
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  double local_120;
  double local_118;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *local_110;
  double local_108;
  double local_100 [3];
  char *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  undefined1 local_b8;
  double local_b0;
  byte local_58;
  undefined8 local_50;
  int local_24;
  value_type local_20;
  FunctionalConstraint *local_18;
  Context local_4;
  
  replace = (undefined1)((uint)in_stack_fffffffffffff78c >> 0x18);
  args._M_elems[0] = SUB84((ulong)in_stack_fffffffffffff7b0 >> 0x20,0);
  iVar2 = (int)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  local_18 = in_RSI;
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId> *)
             (in_RSI + 1));
  pvVar6 = std::array<int,_1UL>::operator[]
                     ((array<int,_1UL> *)in_stack_fffffffffffff720,
                      CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
  local_20 = *pvVar6;
  local_24 = FunctionalConstraint::GetResultVar(local_18);
  PLApproxParams::PLApproxParams((PLApproxParams *)in_stack_fffffffffffff730);
  pMVar7 = &BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC(in_RDI)->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  local_b0 = MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::PLApproxRelTol(pMVar7);
  pMVar7 = &BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC(in_RDI)->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  local_e0 = MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::PLApproxDomain(pMVar7);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  conName = (char *)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    ::lb((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  local_100[0] = -local_e0;
  local_e8 = conName;
  pdVar8 = std::max<double>((double *)&local_e8,local_100);
  local_d8 = *pdVar8;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  local_108 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::ub((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  pdVar8 = std::min<double>(&local_108,&local_e0);
  local_d0 = *pdVar8;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  this_01 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::lb((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  local_118 = -local_e0;
  local_110 = this_01;
  pdVar8 = std::max<double>((double *)&local_110,&local_118);
  local_c8 = *pdVar8;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  dVar10 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::ub((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  local_120 = dVar10;
  pdVar8 = std::min<double>(&local_120,&local_e0);
  iVar3 = (int)((ulong)dVar10 >> 0x20);
  local_c0 = *pdVar8;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  uVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_var_integer((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
  local_b8 = uVar1;
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>::GetTypeName();
  GetWarningKeyAndText_abi_cxx11_(conName,(double)in_RDI);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC(in_RDI);
  std::__cxx11::string::string(local_180,local_160);
  std::__cxx11::string::string(local_1a0,local_140);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddWarning(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff790,
               (bool)replace);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_180);
  PLApproximate<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AsinhId>>
            (in_stack_fffffffffffff780,
             (PLApproxParams *)CONCAT44(in_stack_fffffffffffff77c,in_stack_fffffffffffff778));
  if ((local_58 & 1) == 0) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    local_1a8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::lb((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    local_1b0 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::ub((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(in_stack_fffffffffffff7e0,iVar2,
                      (double)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                      in_stack_fffffffffffff7c8);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    local_1b8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::lb((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    local_1c0 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::ub((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    if ((local_1a8 < local_1b8) || (local_1c0 < local_1b0)) {
      BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::GetMC(in_RDI);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,(allocator<char> *)in_stack_fffffffffffff750);
      CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>::GetTypeName();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728,(char *)in_stack_fffffffffffff720);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                 (char *)in_stack_fffffffffffff758,(allocator<char> *)in_stack_fffffffffffff750);
      CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AsinhId>::GetTypeName();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728,(char *)in_stack_fffffffffffff720);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728,(char *)in_stack_fffffffffffff720);
      std::__cxx11::to_string((double)in_stack_fffffffffffff728);
      std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728,(char *)in_stack_fffffffffffff720);
      std::__cxx11::to_string((double)in_stack_fffffffffffff728);
      std::operator+(in_stack_fffffffffffff758,in_stack_fffffffffffff750);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff728,(char *)in_stack_fffffffffffff720);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AddWarning(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                   (bool)replace);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string(local_248);
      std::__cxx11::string::~string(local_330);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
    }
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    local_3d4 = local_20;
    PLPoints::PLPoints((PLPoints *)in_stack_fffffffffffff730,(PLPoints *)in_stack_fffffffffffff728);
    PLConParams::PLConParams
              ((PLConParams *)in_stack_fffffffffffff730,(PLPoints *)in_stack_fffffffffffff728);
    iVar2 = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
    CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
    ::CustomFunctionalConstraint
              (in_stack_fffffffffffff7a8,args,(Parameters *)in_stack_fffffffffffff7a0);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::
    RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
              (this_01,iVar3,
               (CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                *)CONCAT17(uVar1,in_stack_fffffffffffff830));
    CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
    ::~CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                *)in_stack_fffffffffffff720);
    PLConParams::~PLConParams((PLConParams *)in_stack_fffffffffffff720);
    PLPoints::~PLPoints((PLPoints *)in_stack_fffffffffffff720);
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    FunctionalConstraint::GetResultVar(local_18);
    local_47c = (CtxVal)FunctionalConstraint::GetContext(local_18);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::PropagateResultOfInitExpr(in_stack_fffffffffffff738,iVar2,in_stack_fffffffffffff744);
    NVar11.ir_ = in_stack_fffffffffffff720;
    NVar11.pvn_ = in_stack_fffffffffffff728;
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddVar(in_stack_fffffffffffff730,(double)in_stack_fffffffffffff728,
                      (double)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    local_490 = NVar11;
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    NVar12 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddVar(in_stack_fffffffffffff730,(double)in_stack_fffffffffffff728,
                      (double)in_stack_fffffffffffff720,in_stack_fffffffffffff71c);
    local_4a0 = NVar12;
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    v = local_544;
    iVar2 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x33c13e);
    *(int *)&(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start = iVar2;
    PLPoints::PLPoints((PLPoints *)in_stack_fffffffffffff730,(PLPoints *)in_stack_fffffffffffff728);
    PLConParams::PLConParams
              ((PLConParams *)in_stack_fffffffffffff730,(PLPoints *)in_stack_fffffffffffff728);
    iVar4 = (int)((ulong)in_stack_fffffffffffff730 >> 0x20);
    CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
    ::CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                *)NVar11.pvn_,args,(Parameters *)NVar11.ir_);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::
    RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
              (this_01,iVar3,
               (CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                *)CONCAT17(uVar1,in_stack_fffffffffffff830));
    CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
    ::~CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                *)in_stack_fffffffffffff720);
    PLConParams::~PLConParams((PLConParams *)in_stack_fffffffffffff720);
    PLPoints::~PLPoints((PLPoints *)in_stack_fffffffffffff720);
    pFVar9 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             ::GetMC(in_RDI);
    iVar3 = FunctionalConstraint::GetResultVar(local_18);
    local_5ec = (CtxVal)FunctionalConstraint::GetContext(local_18);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::PropagateResultOfInitExpr(in_stack_fffffffffffff738,iVar4,in_stack_fffffffffffff744);
    this_00 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
              BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ::GetMC(in_RDI);
    local_749._1_8_ = local_50;
    local_749._9_8_ = 0x3ff0000000000000;
    local_749._17_8_ = 0xbff0000000000000;
    local_730 = local_749 + 1;
    local_728 = 3;
    rr.rhs_ = (double)local_749;
    std::allocator<double>::allocator((allocator<double> *)0x33c29e);
    __l._M_len._0_4_ = in_stack_fffffffffffff760;
    __l._M_array = (iterator)pFVar9;
    __l._M_len._4_4_ = iVar3;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l,(allocator_type *)this_00);
    iVar4 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x33c2cf);
    piVar13 = (int *)(local_785 + 5);
    local_785._1_4_ = iVar4;
    iVar5 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x33c2fa);
    *piVar13 = iVar5;
    uVar1 = (undefined1)((ulong)piVar13 >> 0x38);
    local_785._9_4_ = local_20;
    local_785._13_8_ = local_785 + 1;
    local_785._21_8_ = 3;
    this_02 = (vector<double,_std::allocator<double>_> *)local_785;
    std::allocator<int>::allocator((allocator<int> *)0x33c347);
    __l_00._M_len._0_4_ = in_stack_fffffffffffff760;
    __l_00._M_array = (iterator)pFVar9;
    __l_00._M_len._4_4_ = iVar3;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,(allocator_type *)this_00);
    LinTerms::LinTerms((LinTerms *)NVar12.ir_,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(iVar2,in_stack_fffffffffffff788),v);
    AlgConRhs<0>::AlgConRhs(&local_790,0.0);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              (this_00,(LinTerms *)CONCAT44(iVar4,iVar5),rr,(bool)uVar1);
    NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)rr.rhs_,this_00);
    AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)NVar11.ir_);
    LinTerms::~LinTerms((LinTerms *)NVar11.ir_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
    std::allocator<int>::~allocator((allocator<int> *)0x33c42d);
    std::vector<double,_std::allocator<double>_>::~vector(this_02);
    std::allocator<double>::~allocator((allocator<double> *)0x33c447);
  }
  Context::Context(&local_4,CTX_MIX);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)NVar11.ir_);
  PLApproxParams::~PLApproxParams((PLApproxParams *)0x33c5a6);
  return (Context)local_4.value_;
}

Assistant:

Context Convert(const ItemType& con, int ) {
    assert(!con.GetContext().IsNone());
    assert(1==con.GetArguments().size());          // 1 argument var
    auto x = con.GetArguments()[0];
    auto y = con.GetResultVar();
    PLApproxParams laPrm;
    laPrm.ubErr = GetMC().PLApproxRelTol();
    auto dm = GetMC().PLApproxDomain();
    /// Narrow graph domain to +-dm
    laPrm.grDom.lbx = std::max(GetMC().lb(x), -dm);
    laPrm.grDom.ubx = std::min(GetMC().ub(x), dm);
    laPrm.grDom.lby = std::max(GetMC().lb(y), -dm);
    laPrm.grDom.uby = std::min(GetMC().ub(y), dm);
    laPrm.is_x_int = GetMC().is_var_integer(x);

    auto warn = GetWarningKeyAndText(con.GetTypeName(), laPrm.ubErr);
    GetMC().AddWarning( warn.first, warn.second );

    PLApproximate(con, laPrm);
    if (!laPrm.fUsePeriod) {
      auto lbx = GetMC().lb(x);
      auto ubx = GetMC().ub(x);
      GetMC().NarrowVarBounds(x,
                              laPrm.grDomOut.lbx, laPrm.grDomOut.ubx);
      auto lbx1 = GetMC().lb(x);
      auto ubx1 = GetMC().ub(x);
      if (lbx1 > lbx || ubx1 < ubx) {
        GetMC().AddWarning(
            std::string("PLApproxDomain_") + con.GetTypeName(),
            std::string("Argument domain of a '")
                + con.GetTypeName()
                + "'\n"
                  "has been reduced to ["
                + std::to_string(lbx1) + ", "
                + std::to_string(ubx1)
                + "] for numerical reasons\n"
                  "(partially controlled by cvt:plapprox:domain.)");
      }
      GetMC().RedefineVariable(y,
                               PLConstraint({x}, laPrm.plPoints));
      GetMC().PropagateResultOfInitExpr(
            // propagate ctx into new constr
            con.GetResultVar(), con.GetContext());
    } else {
      auto rmd = GetMC().AddVar(
            laPrm.periodRemainderRange.lb,
            laPrm.periodRemainderRange.ub);
      auto factor = GetMC().AddVar(
            laPrm.periodicFactorRange.lb,
            laPrm.periodicFactorRange.ub,
            var::INTEGER);
      GetMC().RedefineVariable(y,
                               PLConstraint({int(rmd)}, laPrm.plPoints));
      GetMC().PropagateResultOfInitExpr(
            // propagate ctx into new constr
            con.GetResultVar(), con.GetContext());
      GetMC().AddConstraint( LinConEQ{  // x = period * factor + rmd
                               { {laPrm.periodLength, 1.0, -1.0},
                                 {int(factor), int(rmd), x} },
                               {0.0} } );
    }
    return Context::CTX_MIX;
  }